

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

ostream * operator<<(ostream *stream,ChunkHeader *header)

{
  pointer pMVar1;
  MaskRect *pMVar2;
  MaskRect *mask;
  pointer pMVar3;
  MaskRect *pMVar4;
  MaskRectRaw m;
  MaskRect local_44;
  Type local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  undefined8 local_36;
  uint16_t local_2e;
  uint32_t local_2c;
  
  local_3c = header->type;
  local_3a = (undefined2)
             ((uint)(*(int *)&(header->masks).
                              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                    *(int *)&(header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_38 = (undefined2)
             ((uint)(*(int *)&(header->transparentMasks).
                              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                    *(int *)&(header->transparentMasks).
                             super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  local_36._0_2_ = header->alignmentWords;
  local_36._2_2_ = header->x;
  local_36._4_2_ = header->y;
  local_36._6_2_ = header->w;
  local_2e = header->h;
  local_2c = header->size;
  std::ostream::write((char *)stream,(long)&local_3c);
  pMVar3 = (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    do {
      local_44 = *pMVar3;
      std::ostream::write((char *)stream,(long)&local_44);
      pMVar3 = pMVar3 + 1;
    } while (pMVar3 != pMVar1);
  }
  pMVar4 = (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar2) {
    do {
      local_44 = *pMVar4;
      std::ostream::write((char *)stream,(long)&local_44);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar2);
  }
  std::ostream::seekp((long)stream,(uint)header->alignmentWords * 2);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const ChunkHeader& header) {
	ChunkHeaderRaw h;
	h.type = static_cast<uint16_t>(header.type);
	h.masks = header.masks.size();
	h.transparentMasks = header.transparentMasks.size();
	h.alignmentWords = header.alignmentWords;
	h.x = header.x;
	h.y = header.y;
	h.w = header.w;
	h.h = header.h;
	h.size = header.size;
	writeRaw(stream, h);
	for (const auto& mask : header.masks) {
		MaskRectRaw m = mask;
		writeRaw(stream, m);
	}
	for (const auto& tmask : header.transparentMasks) {
		MaskRectRaw m = tmask;
		writeRaw(stream, m);
	}
	stream.seekp(header.alignmentWords * 2, stream.cur);
	return stream;
}